

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timespec_get.c
# Opt level: O0

int timespec_get(timespec *ts,int base)

{
  int iVar1;
  undefined1 local_30 [8];
  timeval tv;
  int base_local;
  timespec *ts_local;
  
  if ((base == 1) &&
     (tv.tv_usec._4_4_ = base, iVar1 = gettimeofday((timeval *)local_30,(__timezone_ptr_t)0x0),
     iVar1 == 0)) {
    ts->tv_sec = (time_t)local_30;
    ts->tv_nsec = tv.tv_sec * 1000;
    ts_local._4_4_ = tv.tv_usec._4_4_;
  }
  else {
    ts_local._4_4_ = 0;
  }
  return ts_local._4_4_;
}

Assistant:

int timespec_get( struct timespec * ts, int base )
{
    if ( base == TIME_UTC )
    {
        /* We can make do with a really thin wrapper here. */
        struct timeval tv;

        if ( gettimeofday( &tv, NULL ) == 0 )
        {
            ts->tv_sec = tv.tv_sec;
            ts->tv_nsec = tv.tv_usec * 1000;
            return base;
        }
    }

    /* Not supporting any other time base than TIME_UTC for now. */
    return 0;
}